

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O3

void __thiscall
QHeaderViewPrivate::saveCascadingSectionSize(QHeaderViewPrivate *this,int visual,int size)

{
  Data<QHashPrivate::Node<int,_int>_> *this_00;
  Node<int,_int> *pNVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->cascadingSectionSize).d;
  local_1c = size;
  local_18 = visual;
  if ((this_00 == (Data<QHashPrivate::Node<int,_int>_> *)0x0) ||
     (pNVar1 = QHashPrivate::Data<QHashPrivate::Node<int,_int>_>::findNode<int>(this_00,&local_18),
     pNVar1 == (Node<int,_int> *)0x0)) {
    local_14 = local_18;
    QHash<int,int>::emplace<int_const&>
              ((QHash<int,int> *)&this->cascadingSectionSize,&local_14,&local_1c);
    iVar2 = this->firstCascadingSection;
    if (local_18 <= this->firstCascadingSection) {
      iVar2 = local_18;
    }
    this->firstCascadingSection = iVar2;
    iVar2 = local_18;
    if (local_18 < this->lastCascadingSection) {
      iVar2 = this->lastCascadingSection;
    }
    this->lastCascadingSection = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void saveCascadingSectionSize(int visual, int size) {
        if (!cascadingSectionSize.contains(visual)) {
            cascadingSectionSize.insert(visual, size);
            firstCascadingSection = qMin(firstCascadingSection, visual);
            lastCascadingSection = qMax(lastCascadingSection, visual);
        }
    }